

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  int iVar1;
  bool bVar2;
  ImDrawChannel *pIVar3;
  ImVec4 *pIVar4;
  void **ppvVar5;
  undefined1 local_70 [8];
  ImDrawCmd draw_cmd;
  int local_24;
  int i;
  int old_channels_count;
  int channels_count_local;
  ImDrawList *draw_list_local;
  ImDrawListSplitter *this_local;
  
  bVar2 = false;
  if (this->_Current == 0) {
    bVar2 = this->_Count < 2;
  }
  if (!bVar2) {
    __assert_fail("_Current == 0 && _Count <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                  ,0x4e9,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar1 = (this->_Channels).Size;
  if (iVar1 < channels_count) {
    ImVector<ImDrawChannel>::resize(&this->_Channels,channels_count);
  }
  this->_Count = channels_count;
  pIVar3 = ImVector<ImDrawChannel>::operator[](&this->_Channels,0);
  memset(pIVar3,0,0x20);
  for (local_24 = 1; local_24 < channels_count; local_24 = local_24 + 1) {
    if (local_24 < iVar1) {
      pIVar3 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_24);
      ImVector<ImDrawCmd>::resize(&pIVar3->_CmdBuffer,0);
      pIVar3 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_24);
      ImVector<unsigned_short>::resize(&pIVar3->_IdxBuffer,0);
    }
    else {
      ImVector<ImDrawChannel>::operator[](&this->_Channels,local_24);
      pIVar3 = (ImDrawChannel *)operator_new(0x20);
      (pIVar3->_IdxBuffer).Size = 0;
      (pIVar3->_IdxBuffer).Capacity = 0;
      (pIVar3->_IdxBuffer).Data = (unsigned_short *)0x0;
      (pIVar3->_CmdBuffer).Size = 0;
      (pIVar3->_CmdBuffer).Capacity = 0;
      (pIVar3->_CmdBuffer).Data = (ImDrawCmd *)0x0;
      ImDrawChannel::ImDrawChannel(pIVar3);
    }
    pIVar3 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_24);
    if ((pIVar3->_CmdBuffer).Size == 0) {
      ImDrawCmd::ImDrawCmd((ImDrawCmd *)local_70);
      pIVar4 = ImVector<ImVec4>::back(&draw_list->_ClipRectStack);
      local_70._4_4_ = pIVar4->x;
      unique0x00012004 = pIVar4->y;
      draw_cmd.ClipRect.x = pIVar4->z;
      draw_cmd.ClipRect.y = pIVar4->w;
      ppvVar5 = ImVector<void_*>::back(&draw_list->_TextureIdStack);
      draw_cmd._16_8_ = *ppvVar5;
      pIVar3 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_24);
      ImVector<ImDrawCmd>::push_back(&pIVar3->_CmdBuffer,(ImDrawCmd *)local_70);
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}